

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

void __thiscall Gluco::Solver::setDecisionVar(Solver *this,Var v,bool b)

{
  char *pcVar1;
  bool b_local;
  Var v_local;
  Solver *this_local;
  
  if ((b) && (pcVar1 = vec<char>::operator[](&this->decision,v), *pcVar1 == '\0')) {
    this->dec_vars = this->dec_vars + 1;
  }
  else if ((!b) && (pcVar1 = vec<char>::operator[](&this->decision,v), *pcVar1 != '\0')) {
    this->dec_vars = this->dec_vars + -1;
  }
  pcVar1 = vec<char>::operator[](&this->decision,v);
  *pcVar1 = b;
  insertVarOrder(this,v);
  return;
}

Assistant:

inline void     Solver::setDecisionVar(Var v, bool b) 
{ 
    if      ( b && !decision[v]) dec_vars++;
    else if (!b &&  decision[v]) dec_vars--;

    decision[v] = b;
    insertVarOrder(v);
}